

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraSim.c
# Opt level: O1

Fra_Sml_t * Fra_SmlSimulateSeq(Aig_Man_t *pAig,int nPref,int nFrames,int nWords,int fCheckMiter)

{
  int iVar1;
  Fra_Sml_t *p;
  
  p = Fra_SmlStart(pAig,nPref,nFrames,nWords);
  Fra_SmlInitialize(p,1);
  Fra_SmlSimulateOne(p);
  if (fCheckMiter != 0) {
    iVar1 = Fra_SmlCheckNonConstOutputs(p);
    p->fNonConstOut = iVar1;
  }
  return p;
}

Assistant:

Fra_Sml_t * Fra_SmlSimulateSeq( Aig_Man_t * pAig, int nPref, int nFrames, int nWords, int fCheckMiter )
{
    Fra_Sml_t * p;
    p = Fra_SmlStart( pAig, nPref, nFrames, nWords );
    Fra_SmlInitialize( p, 1 );
    Fra_SmlSimulateOne( p );
    if ( fCheckMiter )
        p->fNonConstOut = Fra_SmlCheckNonConstOutputs( p );
    return p;
}